

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# model.cc
# Opt level: O2

void __thiscall fasttext::Model::computeOutputSoftmax(Model *this,Vector *hidden,Vector *output)

{
  undefined1 auVar1 [16];
  real *prVar2;
  ulong uVar3;
  int32_t i;
  long lVar4;
  double dVar5;
  float local_24;
  float local_20;
  
  Vector::mul(output,(this->wo_).super___shared_ptr<fasttext::Matrix,_(__gnu_cxx::_Lock_policy)2>.
                     _M_ptr,hidden);
  prVar2 = Vector::operator[](output,0);
  local_24 = *prVar2;
  for (lVar4 = 0; uVar3 = (ulong)this->osz_, lVar4 < (long)uVar3; lVar4 = lVar4 + 1) {
    prVar2 = Vector::operator[](output,lVar4);
    auVar1 = vmaxss_avx(ZEXT416((uint)local_24),ZEXT416((uint)*prVar2));
    local_24 = auVar1._0_4_;
  }
  local_20 = 0.0;
  for (lVar4 = 0; lVar4 < (int)uVar3; lVar4 = lVar4 + 1) {
    prVar2 = Vector::operator[](output,lVar4);
    dVar5 = exp((double)(*prVar2 - local_24));
    prVar2 = Vector::operator[](output,lVar4);
    *prVar2 = (float)dVar5;
    prVar2 = Vector::operator[](output,lVar4);
    local_20 = local_20 + *prVar2;
    uVar3 = (ulong)(uint)this->osz_;
  }
  for (lVar4 = 0; lVar4 < (int)uVar3; lVar4 = lVar4 + 1) {
    prVar2 = Vector::operator[](output,lVar4);
    *prVar2 = *prVar2 / local_20;
    uVar3 = (ulong)(uint)this->osz_;
  }
  return;
}

Assistant:

void Model::computeOutputSoftmax(Vector& hidden, Vector& output) const {
  output.mul(*wo_, hidden);
  real max = output[0], z = 0.0;
  for (int32_t i = 0; i < osz_; i++) {
    max = std::max(output[i], max);
  }
  for (int32_t i = 0; i < osz_; i++) {
    output[i] = exp(output[i] - max);
    z += output[i];
  }
  for (int32_t i = 0; i < osz_; i++) {
    output[i] /= z;
  }
}